

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O1

void h265e_dpb_proc_cpb(H265eDpb *dpb,EncCpbStatus *cpb)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  RK_U32 *pRVar6;
  H265eDpbFrm *extraout_RAX;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  H265eDpbFrm *pHVar13;
  
  if (cpb != (EncCpbStatus *)0x0 && dpb != (H265eDpb *)0x0) {
    if (((ulong)cpb->curr & 0x20) == 0) {
      uVar9 = 0;
      bVar4 = false;
LAB_001cd334:
      if ((cpb->init[uVar9].val & 1) != 0) {
        if (((cpb->init[uVar9].val & 0x40) != 0) &&
           (_mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"!frm->is_non_ref"
                       ,"h265e_dpb_proc_cpb",0x30c), (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_001cd61d:
          abort();
        }
        if (((byte)h265e_debug & 0x80) != 0) {
          uVar12 = cpb->init[uVar9].val;
          _mpp_log_l(4,"h265e_dpb","idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",(char *)0x0,
                     uVar9 & 0xffffffff,uVar12 >> 0x30,(uint)uVar12 & 1,(uint)(uVar12 >> 6) & 1,
                     (uint)(uVar12 >> 7) & 1);
        }
        uVar12 = cpb->init[uVar9].val >> 0x30;
        pRVar6 = &h265e_debug;
        if (((byte)h265e_debug & 0x80) != 0) {
          _mpp_log_l(4,"h265e_dpb","frm %d start finding slot \n",(char *)0x0,uVar12);
          pRVar6 = (RK_U32 *)extraout_RAX;
        }
        uVar11 = 0;
        pHVar13 = dpb->frame_list;
        do {
          if (pHVar13->inited != 0) {
            bVar3 = true;
            if ((((pHVar13->status).val & 1) != 0) &&
               (uVar10 = (pHVar13->status).val >> 0x30, uVar10 == uVar12)) {
              if (((byte)h265e_debug & 0x80) != 0) {
                _mpp_log_l(4,"h265e_dpb","frm %d match slot %d valid %d\n",(char *)0x0,uVar10,
                           uVar11 & 0xffffffff,1);
              }
              bVar3 = false;
              pRVar6 = (RK_U32 *)pHVar13;
            }
            if (!bVar3) goto LAB_001cd489;
          }
          uVar11 = uVar11 + 1;
          pHVar13 = pHVar13 + 1;
          if (uVar11 == 0x10) {
            h265e_dpb_proc_cpb_cold_1();
            goto LAB_001cd61d;
          }
        } while( true );
      }
      goto LAB_001cd4bc;
    }
    lVar8 = 0;
    do {
      if (*(int *)((long)&dpb->frame_list[0].inited + lVar8) != 0) {
        *(undefined4 *)(*(long *)((long)&dpb->frame_list[0].slice + lVar8) + 0x678) = 0;
        *(undefined8 *)((long)&dpb->frame_list[0].is_long_term + lVar8) = 0;
        *(undefined1 *)((long)&dpb->frame_list[0].field_7 + lVar8) = 0;
        *(undefined8 *)((long)&dpb->frame_list[0].status + lVar8) = 0;
      }
      lVar8 = lVar8 + 0x60;
    } while (lVar8 != 0x660);
  }
  return;
LAB_001cd489:
  if ((char)*(ushort *)&((H265eDpbFrm *)pRVar6)->field_7 == '\0') {
    *(ushort *)&((H265eDpbFrm *)pRVar6)->field_7 = *(ushort *)&((H265eDpbFrm *)pRVar6)->field_7 | 1;
    ((H265eDpbFrm *)pRVar6)->status = cpb->init[uVar9];
    ((H265eDpbFrm *)pRVar6)->slice->is_referenced = 1;
    bVar4 = true;
  }
LAB_001cd4bc:
  uVar9 = uVar9 + 1;
  if (uVar9 == 8) {
    if (bVar4) {
      if (((byte)h265e_debug & 0x80) != 0) {
        _mpp_log_l(4,"h265e_dpb","cpb roll back found",(char *)0x0);
      }
      iVar5 = 0;
      lVar8 = 0x3c0;
      iVar7 = 0;
      do {
        if (*(char *)((long)(dpb->RpsList).poc + lVar8 + -0x44) != '\0') {
          lVar2 = *(long *)((long)(dpb->RpsList).poc + lVar8 + -0x2c);
          iVar1 = *(int *)(lVar2 + 0x10);
          if (iVar7 <= iVar1) {
            iVar7 = iVar1;
          }
          iVar1 = *(int *)(lVar2 + 0x14);
          if (iVar5 <= iVar1) {
            iVar5 = iVar1;
          }
        }
        lVar8 = lVar8 + 0x60;
      } while (lVar8 != 0xa20);
      pHVar13 = dpb->curr;
      if (pHVar13->inited != 0) {
        pHVar13->slice->is_referenced = 0;
        pHVar13->is_long_term = 0;
        pHVar13->used_by_cur = 0;
        *(undefined1 *)&pHVar13->field_7 = 0;
        (pHVar13->status).val = 0;
      }
      dpb->seq_idx = iVar7;
      dpb->gop_idx = iVar5;
    }
    pRVar6 = &dpb->frame_list[0].inited;
    uVar9 = 0;
    do {
      if ((*pRVar6 != 0) && (*(char *)(pRVar6 + -1) == '\0')) {
        if (((byte)h265e_debug & 0x80) != 0) {
          _mpp_log_l(4,"h265e_dpb","reset index %d frame->inited %d rame->on_used %x",(char *)0x0,
                     uVar9 & 0xffffffff,(ulong)*pRVar6,
                     ((anon_union_4_2_f1ea2294_for_H265eDpbFrm_t_7 *)(pRVar6 + -1))->on_used);
        }
        ((EncFrmStatus *)(pRVar6 + -3))->val = 0;
      }
      uVar9 = uVar9 + 1;
      pRVar6 = pRVar6 + 0x18;
    } while (uVar9 != 0x11);
    return;
  }
  goto LAB_001cd334;
}

Assistant:

void h265e_dpb_proc_cpb(H265eDpb *dpb, EncCpbStatus *cpb)
{
    EncFrmStatus *curr = &cpb->curr;
    RK_U32 index = 0, i = 0;
    H265eDpbFrm *p = NULL;
    RK_U32 need_rebuild = 0;
    RK_S32 max_gop_id = 0, max_poc = 0;

    if (!dpb || !cpb)
        return;

    if (curr->is_idr) {
        for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
            H265eDpbFrm *frame = &dpb->frame_list[index];
            if (frame->inited) {
                frame->slice->is_referenced = 0;
                frame->is_long_term = 0;
                frame->used_by_cur = 0;
                frame->dpb_used = 0;
                frame->status.val = 0;
            }
        }
        return;
    }

    for (i = 0; i < MAX_CPB_REFS; i++) {
        EncFrmStatus *frm = &cpb->init[i];

        if (!frm->valid)
            continue;

        mpp_assert(!frm->is_non_ref);

        h265e_dbg_dpb("idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",
                      i, frm->seq_idx, frm->valid, frm->is_non_ref, frm->is_lt_ref);

        p = h265e_find_cpb_in_dpb(dpb->frame_list, MAX_REFS, frm);
        if (!p->dpb_used) {
            p->dpb_used = 1;
            p->status.val = frm->val;
            p->slice->is_referenced = 1;
            need_rebuild = 1;
        }
    }

    if (need_rebuild) {
        h265e_dbg_dpb("cpb roll back found");
        for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
            H265eDpbFrm *frame = &dpb->frame_list[index];

            if (frame->dpb_used) {
                if (max_poc < frame->slice->poc) {
                    max_poc = frame->slice->poc;
                }
                if (max_gop_id < frame->slice->gop_idx) {
                    max_gop_id = frame->slice->gop_idx;
                }
            }
        }

        H265eDpbFrm *frame = dpb->curr;

        if (frame->inited) {
            frame->slice->is_referenced = 0;
            frame->is_long_term = 0;
            frame->used_by_cur = 0;
            frame->dpb_used = 0;
            frame->status.val = 0;
        }
        dpb->seq_idx = max_poc;
        dpb->gop_idx = max_gop_id;
    }

    for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
        H265eDpbFrm *frame = &dpb->frame_list[index];

        if (frame->inited && !frame->dpb_used) {
            h265e_dbg_dpb("reset index %d frame->inited %d rame->on_used %x",
                          index, frame->inited, frame->on_used);
            frame->status.val = 0;
        }
    }
}